

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall UnitUtilTest_invOverflows_Test::TestBody(UnitUtilTest_invOverflows_Test *this)

{
  bool bVar1;
  unit_data uVar2;
  pointer *__ptr;
  pointer *__ptr_1;
  char *in_R9;
  unit inv_mol;
  AssertionResult gtest_ar_;
  AssertHelper local_58;
  undefined8 local_50;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  local_50._0_4_ = 1;
  local_30._M_dataplus._M_p._0_4_ = 0;
  bVar1 = units::detail::divides_overflows((unit_data *)&local_30,(unit_data *)&local_50);
  local_40[0] = (internal)!bVar1;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"inv_overflows(m)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x4f9,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                       local_30._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_30._M_dataplus._M_p._4_4_,local_30._M_dataplus._M_p._0_4_) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_30._M_dataplus._M_p._4_4_,local_30._M_dataplus._M_p._0_4_),
                      local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::one + 4),(unit_data *)((long)&units::mol + 4));
  local_50 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(uint)uVar2 << 0x20 | 0x3f800000);
  local_58.data_._0_4_ =
       units::detail::unit_data::operator*
                 ((unit_data *)((long)&local_50 + 4),(unit_data *)((long)&local_50 + 4));
  local_30._M_dataplus._M_p._0_4_ = 0;
  local_40[0] = (internal)
                units::detail::divides_overflows((unit_data *)&local_30,(unit_data *)&local_58);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"inv_overflows(inv_mol * inv_mol)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x4fc,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                       local_30._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_30._M_dataplus._M_p._4_4_,local_30._M_dataplus._M_p._0_4_) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_30._M_dataplus._M_p._4_4_,local_30._M_dataplus._M_p._0_4_),
                      local_30.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST(UnitUtilTest, invOverflows)
{
    EXPECT_FALSE(inv_overflows(m));
    const auto inv_mol = one / mol;
    if (units::detail::bitwidth::base_size == 4) {
        EXPECT_TRUE(inv_overflows(inv_mol * inv_mol));
    } else {
        EXPECT_FALSE(inv_overflows(inv_mol * inv_mol));
    }
}